

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

void __thiscall QWidgetPrivate::update<QRegion>(QWidgetPrivate *this,QRegion r)

{
  undefined1 *puVar1;
  QWidgetData **ppQVar2;
  QWidget *widget;
  QWidget *pQVar3;
  char cVar4;
  QEvent *this_00;
  long lVar5;
  QWidget *pQVar6;
  long in_FS_OFFSET;
  QRegion clipped;
  QRegion local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  widget = *(QWidget **)&this->field_0x8;
  if (((*(uint *)&this->field_0x250 >> 0x18 & 1) == 0) ||
     ((widget->data->widget_attributes & 0x8000) != 0)) {
    if ((widget->data->widget_attributes & 0x8400) == 0x8000) {
      local_20.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
      QRegion::operator&(&local_20,(QRect *)r.d);
      cVar4 = QRegion::isEmpty();
      if (cVar4 == '\0') {
        pQVar6 = widget;
        if ((*(byte *)(*(long *)&widget->field_0x8 + 0x243) & 0x40) == 0) {
          do {
            puVar1 = &pQVar6->field_0x8;
            pQVar3 = *(QWidget **)(*(long *)puVar1 + 0x10);
            if (pQVar3 == (QWidget *)0x0) break;
            ppQVar2 = &pQVar6->data;
            pQVar6 = pQVar3;
          } while ((((*ppQVar2)->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
                    super_QFlagsStorage<Qt::WindowType>.i & 1) == 0);
          lVar5 = *(long *)(*(long *)puVar1 + 0x78);
          if (lVar5 == 0) {
            lVar5 = 0;
          }
          else {
            lVar5 = *(long *)(lVar5 + 8);
          }
          if (((lVar5 != 0) && (*(long *)(lVar5 + 0x10) != 0)) &&
             (*(QWidgetRepaintManager **)(lVar5 + 8) != (QWidgetRepaintManager *)0x0)) {
            QWidgetRepaintManager::markDirty<QRegion>
                      (*(QWidgetRepaintManager **)(lVar5 + 8),&local_20,widget,UpdateLater,
                       BufferValid);
          }
        }
        else {
          this_00 = (QEvent *)operator_new(0x18);
          QEvent::QEvent(this_00,UpdateLater);
          *(undefined ***)this_00 = &PTR__QUpdateLaterEvent_007f5d78;
          QRegion::QRegion((QRegion *)(this_00 + 0x10),&local_20);
          QCoreApplication::postEvent(&widget->super_QObject,this_00,0);
        }
      }
      QRegion::~QRegion(&local_20);
    }
  }
  else {
    *(uint *)&this->field_0x250 = *(uint *)&this->field_0x250 | 0x8000000;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetPrivate::update(T r)
{
    Q_Q(QWidget);

    if (renderToTexture && !q->isVisible()) {
        renderToTextureReallyDirty = 1;
        return;
    }

    if (!q->isVisible() || !q->updatesEnabled())
        return;

    T clipped = r & q->rect();

    if (clipped.isEmpty())
        return;

    if (q->testAttribute(Qt::WA_WState_InPaintEvent)) {
        QCoreApplication::postEvent(q, new QUpdateLaterEvent(clipped));
        return;
    }

    QTLWExtra *tlwExtra = q->window()->d_func()->maybeTopData();
    if (tlwExtra && tlwExtra->backingStore && tlwExtra->repaintManager)
        tlwExtra->repaintManager->markDirty(clipped, q);
}